

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::WriteTargetLinkDependRules(cmMakefileTargetGenerator *this)

{
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  allocator<char> local_a9;
  string depFile;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_(&depFile,this);
  bVar3 = cmGeneratorTarget::HasLinkDependencyFile(pcVar1,&depFile);
  std::__cxx11::string::~string((string *)&depFile);
  if (bVar3) {
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pcVar2 = this->LocalGenerator;
    GetConfigName_abi_cxx11_(&local_88,this);
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter.
      _vptr_cmOutputConverter[0xb])(&depFile,pcVar2,pcVar1);
    std::__cxx11::string::~string((string *)&local_88);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->CleanFiles,&depFile);
    pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    pcVar2 = this->LocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"LINK",&local_a9);
    this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    GetConfigName_abi_cxx11_(&local_68,this);
    cmGeneratorTarget::GetFullPath(&local_48,this_00,&local_68,RuntimeBinaryArtifact,false);
    cmLocalUnixMakefileGenerator3::AddImplicitDepends
              (pcVar2,pcVar1,&local_88,&local_48,&depFile,Compiler);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&depFile);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetLinkDependRules()
{
  if (!this->GeneratorTarget->HasLinkDependencyFile(this->GetConfigName())) {
    return;
  }

  auto depFile = this->LocalGenerator->GetLinkDependencyFile(
    this->GeneratorTarget, this->GetConfigName());
  this->CleanFiles.insert(depFile);
  this->LocalGenerator->AddImplicitDepends(
    this->GeneratorTarget, "LINK",
    this->GeneratorTarget->GetFullPath(this->GetConfigName()), depFile,
    cmDependencyScannerKind::Compiler);
}